

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_select(lua_State *L)

{
  TValue *pTVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  
  pTVar1 = L->base;
  iVar4 = (int)((ulong)((long)L->top - (long)pTVar1) >> 3);
  if (((iVar4 < 1) || ((pTVar1->field_2).it != 0xfffffffb)) ||
     (*(char *)((ulong)(pTVar1->u32).lo + 0x10) != '#')) {
    iVar2 = lj_lib_checkint(L,1);
    iVar3 = iVar4;
    if (iVar2 < iVar4) {
      iVar3 = iVar2;
    }
    if (iVar2 < 0) {
      iVar3 = iVar2 + iVar4;
    }
    if (iVar3 < 1) {
      lj_err_arg(L,1,LJ_ERR_IDXRNG);
    }
    iVar4 = iVar4 - iVar3;
  }
  else {
    L->top[-1].n = (double)(iVar4 + -1);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

LJLIB_CF(select)		LJLIB_REC(.)
{
  int32_t n = (int32_t)(L->top - L->base);
  if (n >= 1 && tvisstr(L->base) && *strVdata(L->base) == '#') {
    setintV(L->top-1, n-1);
    return 1;
  } else {
    int32_t i = lj_lib_checkint(L, 1);
    if (i < 0) i = n + i; else if (i > n) i = n;
    if (i < 1)
      lj_err_arg(L, 1, LJ_ERR_IDXRNG);
    return n - i;
  }
}